

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int ptls_import(ptls_context_t *ctx,ptls_t **tls,ptls_iovec_t params)

{
  long lVar1;
  int iVar2;
  byte *end_00;
  ptls_t *ppVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  ptls_cipher_suite_t *ppVar6;
  ptls_key_schedule_t *ppVar7;
  undefined4 uVar8;
  ptls_context_t *ppVar9;
  uint8_t *end_5;
  uint8_t *_src_4;
  uint64_t _block_size64_4;
  size_t _block_size_4;
  size_t _capacity_4;
  uint8_t *end_4;
  uint8_t *_src_3;
  uint64_t _block_size64_3;
  size_t _block_size_3;
  size_t _capacity_3;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  int ret;
  uint16_t csid;
  uint16_t protocol_version;
  uint8_t *end;
  uint8_t *src;
  ptls_t **tls_local;
  ptls_context_t *ctx_local;
  ptls_iovec_t params_local;
  
  params_local.base = (uint8_t *)params.len;
  ctx_local = (ptls_context_t *)params.base;
  _ret = params_local.base + (long)&ctx_local->random_bytes;
  *tls = (ptls_t *)0x0;
  _block_size = 2;
  src = (uint8_t *)tls;
  tls_local = (ptls_t **)ctx;
  if ((ulong)((long)_ret - (long)ctx_local) < 2) {
    _capacity._0_4_ = 0x32;
    end = (uint8_t *)ctx_local;
  }
  else {
    _block_size64 = 0;
    ppVar9 = ctx_local;
    do {
      end = (uint8_t *)ppVar9;
      ppVar9 = (ptls_context_t *)(end + 1);
      _block_size64 = _block_size64 << 8 | (ulong)*end;
      _block_size = _block_size - 1;
    } while (_block_size != 0);
    if ((ulong)((long)_ret - (long)ppVar9) < _block_size64) {
      _capacity._0_4_ = 0x32;
      end = (uint8_t *)ppVar9;
    }
    else {
      end_00 = (byte *)((long)ppVar9 + _block_size64);
      if ((long)end_00 - (long)ppVar9 < 2) {
        _capacity._0_4_ = 0x32;
        end = (uint8_t *)ppVar9;
      }
      else {
        end = end + 2;
        ppVar3 = new_instance(ctx,(uint)*(byte *)ppVar9);
        *(ptls_t **)src = ppVar3;
        if (ppVar3 == (ptls_t *)0x0) {
          _capacity._0_4_ = 0x201;
        }
        else {
          *(byte *)(*(long *)src + 0x1e8) = *(byte *)(*(long *)src + 0x1e8) & 0xfd | (*end & 1) << 1
          ;
          end = end + 1;
          _capacity._0_4_ = ptls_decode16((uint16_t *)((long)&_capacity + 6),&end,end_00);
          if (((int)_capacity == 0) &&
             (_capacity._0_4_ = ptls_decode16((uint16_t *)((long)&_capacity + 4),&end,end_00),
             (int)_capacity == 0)) {
            if ((long)end_00 - (long)end < 0x20) {
              _capacity._0_4_ = 0x32;
            }
            else {
              lVar1 = *(long *)src;
              *(undefined8 *)(lVar1 + 0x148) = *(undefined8 *)end;
              *(undefined8 *)(lVar1 + 0x150) = *(undefined8 *)(end + 8);
              *(undefined8 *)(lVar1 + 0x158) = *(undefined8 *)(end + 0x10);
              *(undefined8 *)(lVar1 + 0x160) = *(undefined8 *)(end + 0x18);
              end = end + 0x20;
              _block_size_1 = 2;
              if ((ulong)((long)end_00 - (long)end) < 2) {
                _capacity._0_4_ = 0x32;
              }
              else {
                _block_size64_1 = 0;
                do {
                  puVar5 = end + 1;
                  _block_size64_1 = _block_size64_1 << 8 | (ulong)*end;
                  _block_size_1 = _block_size_1 - 1;
                  end = puVar5;
                } while (_block_size_1 != 0);
                if ((ulong)((long)end_00 - (long)puVar5) < _block_size64_1) {
                  _capacity._0_4_ = 0x32;
                }
                else {
                  puVar4 = puVar5 + _block_size64_1;
                  if ((puVar5 == puVar4) ||
                     (_capacity._0_4_ =
                           ptls_set_server_name
                                     (*(ptls_t **)src,(char *)puVar5,(long)puVar4 - (long)puVar5),
                     puVar5 = puVar4, (int)_capacity == 0)) {
                    end = puVar5;
                    _capacity._0_4_ = 0;
                    if (end == puVar4) {
                      _block_size_2 = 2;
                      if ((ulong)((long)end_00 - (long)end) < 2) {
                        _capacity._0_4_ = 0x32;
                      }
                      else {
                        _block_size64_2 = 0;
                        do {
                          puVar5 = end + 1;
                          _block_size64_2 = _block_size64_2 << 8 | (ulong)*end;
                          _block_size_2 = _block_size_2 - 1;
                          end = puVar5;
                        } while (_block_size_2 != 0);
                        if ((ulong)((long)end_00 - (long)puVar5) < _block_size64_2) {
                          _capacity._0_4_ = 0x32;
                        }
                        else {
                          puVar4 = puVar5 + _block_size64_2;
                          if ((puVar5 == puVar4) ||
                             (_capacity._0_4_ =
                                   ptls_set_negotiated_protocol
                                             (*(ptls_t **)src,(char *)puVar5,
                                              (long)puVar4 - (long)puVar5), puVar5 = puVar4,
                             (int)_capacity == 0)) {
                            end = puVar5;
                            _capacity._0_4_ = 0;
                            if (end == puVar4) {
                              _block_size_3 = 2;
                              if ((ulong)((long)end_00 - (long)end) < 2) {
                                _capacity._0_4_ = 0x32;
                              }
                              else {
                                _block_size64_3 = 0;
                                do {
                                  puVar5 = end + 1;
                                  _block_size64_3 = _block_size64_3 << 8 | (ulong)*end;
                                  _block_size_3 = _block_size_3 - 1;
                                  end = puVar5;
                                } while (_block_size_3 != 0);
                                if ((ulong)((long)end_00 - (long)puVar5) < _block_size64_3) {
                                  _capacity._0_4_ = 0x32;
                                }
                                else {
                                  puVar5 = puVar5 + _block_size64_3;
                                  if (_capacity._6_2_ == 0x303) {
                                    ppVar6 = ptls_find_cipher_suite
                                                       ((ptls_cipher_suite_t **)tls_local[0x1f],
                                                        _capacity._4_2_);
                                    *(ptls_cipher_suite_t **)(*(long *)src + 0x140) = ppVar6;
                                    if (*(long *)(*(long *)src + 0x140) == 0) {
                                      _capacity._0_4_ = 0x28;
                                      goto LAB_00119306;
                                    }
                                    _capacity._0_4_ =
                                         import_tls12_traffic_protection
                                                   (*(ptls_t **)src,1,&end,puVar5);
                                    if ((int)_capacity != 0) goto LAB_00119306;
                                    _capacity._0_4_ =
                                         import_tls12_traffic_protection
                                                   (*(ptls_t **)src,0,&end,puVar5);
                                  }
                                  else {
                                    if (_capacity._6_2_ != 0x304) {
                                      _capacity._0_4_ = 0x2f;
                                      goto LAB_00119306;
                                    }
                                    ppVar6 = ptls_find_cipher_suite
                                                       ((ptls_cipher_suite_t **)tls_local[3],
                                                        _capacity._4_2_);
                                    *(ptls_cipher_suite_t **)(*(long *)src + 0x140) = ppVar6;
                                    if (*(long *)(*(long *)src + 0x140) == 0) {
                                      _capacity._0_4_ = 0x28;
                                      goto LAB_00119306;
                                    }
                                    ppVar7 = key_schedule_new(*(ptls_cipher_suite_t **)
                                                               (*(long *)src + 0x140),
                                                              (ptls_cipher_suite_t **)0x0,
                                                              (uint)(*(long *)(*(long *)src + 400)
                                                                    != 0));
                                    *(ptls_key_schedule_t **)(*(long *)src + 0x50) = ppVar7;
                                    if (ppVar7 == (ptls_key_schedule_t *)0x0) {
                                      _capacity._0_4_ = 0x201;
                                      goto LAB_00119306;
                                    }
                                    _capacity._0_4_ =
                                         import_tls13_traffic_protection
                                                   (*(ptls_t **)src,1,&end,puVar5);
                                    if ((int)_capacity != 0) goto LAB_00119306;
                                    _capacity._0_4_ =
                                         import_tls13_traffic_protection
                                                   (*(ptls_t **)src,0,&end,puVar5);
                                  }
                                  if ((int)_capacity == 0) {
                                    if (end == puVar5) {
                                      _block_size_4 = 2;
                                      if ((ulong)((long)end_00 - (long)end) < 2) {
                                        _capacity._0_4_ = 0x32;
                                      }
                                      else {
                                        _block_size64_4 = 0;
                                        do {
                                          puVar5 = end + 1;
                                          _block_size64_4 = _block_size64_4 << 8 | (ulong)*end;
                                          _block_size_4 = _block_size_4 - 1;
                                          end = puVar5;
                                        } while (_block_size_4 != 0);
                                        if ((ulong)((long)end_00 - (long)puVar5) < _block_size64_4)
                                        {
                                          _capacity._0_4_ = 0x32;
                                        }
                                        else {
                                          end = puVar5 + _block_size64_4;
                                          if (end == end_00) {
                                            if (end == _ret) {
                                              iVar2 = ptls_is_server(*(ptls_t **)src);
                                              uVar8 = 0xf;
                                              if (iVar2 != 0) {
                                                uVar8 = 0x10;
                                              }
                                              *(undefined4 *)(*(long *)src + 8) = uVar8;
                                            }
                                            else {
                                              _capacity._0_4_ = 0x32;
                                            }
                                          }
                                          else {
                                            _capacity._0_4_ = 0x32;
                                          }
                                        }
                                      }
                                    }
                                    else {
                                      _capacity._0_4_ = 0x32;
                                    }
                                  }
                                }
                              }
                            }
                            else {
                              _capacity._0_4_ = 0x32;
                            }
                          }
                        }
                      }
                    }
                    else {
                      _capacity._0_4_ = 0x32;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00119306:
  if (((int)_capacity != 0) && (*(long *)src != 0)) {
    ptls_free(*(ptls_t **)src);
    src[0] = '\0';
    src[1] = '\0';
    src[2] = '\0';
    src[3] = '\0';
    src[4] = '\0';
    src[5] = '\0';
    src[6] = '\0';
    src[7] = '\0';
  }
  return (int)_capacity;
}

Assistant:

int ptls_import(ptls_context_t *ctx, ptls_t **tls, ptls_iovec_t params)
{
    const uint8_t *src = params.base, *const end = src + params.len;
    uint16_t protocol_version, csid;
    int ret;

    *tls = NULL;

    /* TODO handle flags like psk_handshake, ech_handshake as we add support for TLS/1.3 import */
    ptls_decode_block(src, end, 2, {
        /* instantiate, based on the is_server flag */
        if (end - src < 2) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((*tls = new_instance(ctx, *src++)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        (*tls)->is_psk_handshake = *src++;
        /* determine protocol version and cipher suite */
        if ((ret = ptls_decode16(&protocol_version, &src, end)) != 0)
            goto Exit;
        if ((ret = ptls_decode16(&csid, &src, end)) != 0)
            goto Exit;
        /* other version-independent stuff */
        if (end - src < PTLS_HELLO_RANDOM_SIZE) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        memcpy((*tls)->client_random, src, PTLS_HELLO_RANDOM_SIZE);
        src += PTLS_HELLO_RANDOM_SIZE;
        ptls_decode_open_block(src, end, 2, {
            if (src != end) {
                if ((ret = ptls_set_server_name(*tls, (const char *)src, end - src)) != 0)
                    goto Exit;
                src = end;
            }
        });
        ptls_decode_open_block(src, end, 2, {
            if (src != end) {
                if ((ret = ptls_set_negotiated_protocol(*tls, (const char *)src, end - src)) != 0)
                    goto Exit;
                src = end;
            }
        });
        /* version-dependent stuff */
        ptls_decode_open_block(src, end, 2, {
            switch (protocol_version) {
            case PTLS_PROTOCOL_VERSION_TLS12:
                (*tls)->cipher_suite = ptls_find_cipher_suite(ctx->tls12_cipher_suites, csid);
                if ((*tls)->cipher_suite == NULL) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
                /* setup AEAD keys */
                if ((ret = import_tls12_traffic_protection(*tls, 1, &src, end)) != 0)
                    goto Exit;
                if ((ret = import_tls12_traffic_protection(*tls, 0, &src, end)) != 0)
                    goto Exit;
                break;
            case PTLS_PROTOCOL_VERSION_TLS13:
                (*tls)->cipher_suite = ptls_find_cipher_suite(ctx->cipher_suites, csid);
                if ((*tls)->cipher_suite == NULL) {
                    ret = PTLS_ALERT_HANDSHAKE_FAILURE;
                    goto Exit;
                }
                /* setup AEAD keys */
                if (((*tls)->key_schedule = key_schedule_new((*tls)->cipher_suite, NULL, (*tls)->ech.aead != NULL)) == NULL) {
                    ret = PTLS_ERROR_NO_MEMORY;
                    goto Exit;
                }
                if ((ret = import_tls13_traffic_protection(*tls, 1, &src, end)) != 0)
                    goto Exit;
                if ((ret = import_tls13_traffic_protection(*tls, 0, &src, end)) != 0)
                    goto Exit;
                break;
            default:
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
        });
        /* extensions */
        ptls_decode_open_block(src, end, 2, {
            src = end; /* unused */
        });
    });

    (*tls)->state = ptls_is_server(*tls) ? PTLS_STATE_SERVER_POST_HANDSHAKE : PTLS_STATE_CLIENT_POST_HANDSHAKE;

Exit:
    if (ret != 0) {
        if (*tls != NULL) {
            ptls_free(*tls);
            *tls = NULL;
        }
    }
    return ret;
}